

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O3

wchar_t ui_entry_search(char *name,int *ind)

{
  ui_entry **ppuVar1;
  int iVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  
  ppuVar1 = entries;
  if (n_entry == L'\0') {
    wVar4 = L'\0';
    wVar3 = L'\0';
  }
  else {
    wVar3 = L'\0';
    wVar5 = n_entry;
    do {
      wVar4 = (wVar5 + wVar3) / 2;
      iVar2 = strcmp(ppuVar1[wVar4]->name,name);
      if (iVar2 == 0) {
        wVar3 = L'\x01';
        goto LAB_001c7730;
      }
      if (iVar2 < 0) {
        wVar3 = wVar4 + L'\x01';
        wVar4 = wVar5;
      }
      wVar5 = wVar4;
    } while (wVar3 != wVar5);
    wVar3 = L'\0';
    wVar4 = wVar5;
  }
LAB_001c7730:
  *ind = wVar4;
  return wVar3;
}

Assistant:

static int ui_entry_search(const char *name, int *ind)
{
	/* They're sorted by name so use a binary search. */
	int ilow = 0, ihigh = n_entry;

	while (1) {
		int imid, cmp;

		if (ilow == ihigh) {
			*ind = ilow;
			return 0;
		}
		imid = (ilow + ihigh) / 2;
		cmp = strcmp(entries[imid]->name, name);
		if (cmp == 0) {
			*ind = imid;
			return 1;
		}
		if (cmp < 0) {
			ilow = imid + 1;
		} else {
			ihigh = imid;
		}
	}
}